

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeRefTest(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Type type)

{
  RefTest *pRVar1;
  bool bVar2;
  Ok local_b1;
  uintptr_t local_b0;
  uint local_a4;
  Err local_a0;
  Err *local_70;
  Err *err;
  Result<wasm::Ok> _val;
  RefTest curr;
  IRBuilder *this_local;
  Type type_local;
  
  pRVar1 = (RefTest *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  RefTest::RefTest(pRVar1);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitRefTest
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pRVar1);
  local_70 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar2 = local_70 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_a0,local_70);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_a0);
    wasm::Err::~Err(&local_a0);
  }
  local_a4 = (uint)bVar2;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_a4 == 0) {
    local_b0 = type.id;
    pRVar1 = Builder::makeRefTest
                       (&this->builder,
                        (Expression *)
                        curr.super_SpecificExpression<(wasm::Expression::Id)62>.super_Expression.
                        type.id,type);
    push(this,(Expression *)pRVar1);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_b1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeRefTest(Type type) {
  RefTest curr;
  curr.castType = type;
  CHECK_ERR(visitRefTest(&curr));
  push(builder.makeRefTest(curr.ref, type));
  return Ok{};
}